

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_to_binary(void *dst,netaddr *src,size_t len)

{
  byte bVar1;
  uint uVar2;
  uint32_t addr_len;
  size_t len_local;
  netaddr *src_local;
  void *dst_local;
  
  bVar1 = netaddr_get_af_maxprefix((uint)src->_type);
  uVar2 = (int)(uint)bVar1 >> 3;
  if ((uVar2 == 0) || (len < uVar2)) {
    dst_local._4_4_ = -1;
  }
  else {
    memcpy(dst,src,(ulong)uVar2);
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

int
netaddr_to_binary(void *dst, const struct netaddr *src, size_t len) {
  uint32_t addr_len;

  addr_len = netaddr_get_maxprefix(src) >> 3;
  if (addr_len == 0 || len < addr_len) {
    /* unknown address type */
    return -1;
  }

  memcpy(dst, src->_addr, addr_len);
  return 0;
}